

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void entryIncrease(UResourceDataEntry *entry)

{
  UResourceDataEntry *local_10;
  UResourceDataEntry *entry_local;
  
  umtx_lock_63(&resbMutex);
  entry->fCountExisting = entry->fCountExisting + 1;
  local_10 = entry;
  while (local_10->fParent != (UResourceDataEntry *)0x0) {
    local_10 = local_10->fParent;
    local_10->fCountExisting = local_10->fCountExisting + 1;
  }
  umtx_unlock_63(&resbMutex);
  return;
}

Assistant:

static void entryIncrease(UResourceDataEntry *entry) {
    umtx_lock(&resbMutex);
    entry->fCountExisting++;
    while(entry->fParent != NULL) {
      entry = entry->fParent;
      entry->fCountExisting++;
    }
    umtx_unlock(&resbMutex);
}